

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_render.cpp
# Opt level: O0

void __thiscall TexturesOnViewportEdge::check(TexturesOnViewportEdge *this)

{
  bool bVar1;
  Surface *this_00;
  ostream *poVar2;
  void *pvVar3;
  ostream *poVar4;
  char *pcVar5;
  vec4 local_420;
  vec4 local_410;
  vec4 local_400;
  vec4 local_3f0;
  vec4 local_3e0;
  vec4 local_3d0;
  vec4 local_3c0;
  vec4 local_3b0;
  vec4 local_3a0;
  vec4 local_390;
  vec4 local_380;
  vec4 local_370;
  vec4 local_360;
  vec4 local_350;
  vec4 local_340;
  vec4 local_330;
  vec4 local_320;
  vec4 local_310;
  vec4 local_300;
  vec4 local_2f0;
  vec4 local_2e0;
  vec4 local_2d0;
  vec4 local_2c0;
  vec4 local_2b0;
  vec4 local_2a0;
  vec4 local_290;
  vec4 local_280;
  vec4 local_270;
  vec4 local_260;
  vec4 local_250;
  vec4 local_240;
  vec4 local_230;
  vec4 local_220;
  vec4 local_210;
  vec4 local_200;
  vec4 local_1f0;
  vec4 local_1e0;
  vec4 local_1d0;
  vec4 local_1c0;
  vec4 local_1b0;
  vec4 local_1a0;
  vec4 local_190;
  vec4 local_180;
  vec4 local_170;
  vec4 local_160;
  vec4 local_150;
  vec4 local_140;
  vec4 local_130;
  vec4 local_120;
  vec4 local_110;
  vec4 local_100;
  vec4 local_f0;
  vec4 local_e0;
  vec4 local_d0;
  vec4 local_c0;
  vec4 local_b0;
  vec4 local_a0;
  vec4 local_90;
  vec4 local_80;
  vec4 local_70;
  vec4 local_60;
  vec4 local_50;
  vec4 local_40;
  vec4 local_30;
  int local_20;
  uint local_1c;
  int b;
  int r;
  vec2 s;
  TexturesOnViewportEdge *this_local;
  
  s = (vec2)this;
  this_00 = rengine::StaticRenderTest::surface(&this->super_StaticRenderTest);
  _b = rengine::Surface::size(this_00);
  local_1c = (uint)((float)b - 1.0);
  local_20 = (int)((float)r - 1.0);
  if ((this->super_StaticRenderTest).m_w < 1) {
    __assert_fail("0 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x77,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 1) {
    __assert_fail("0 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x77,"virtual void TexturesOnViewportEdge::check()");
  }
  local_30 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,0);
  rengine::vec4::vec4(&local_40,0.5,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_30,local_40,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x0;
    local_50 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,0);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_50);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_60,0.5,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_60);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x77,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 2) {
    __assert_fail("1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x78,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 1) {
    __assert_fail("0 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x78,"virtual void TexturesOnViewportEdge::check()");
  }
  local_70 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,0);
  rengine::vec4::vec4(&local_80,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_70,local_80,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,1);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x1;
    local_90 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,0);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_90);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_a0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_a0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x78,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 2) {
    __assert_fail("1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x79,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 2) {
    __assert_fail("1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x79,"virtual void TexturesOnViewportEdge::check()");
  }
  local_b0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,1);
  rengine::vec4::vec4(&local_c0,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_b0,local_c0,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,1);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x1;
    local_d0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,1);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_d0);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_e0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x79,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 1) {
    __assert_fail("0 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7a,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 2) {
    __assert_fail("1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7a,"virtual void TexturesOnViewportEdge::check()");
  }
  local_f0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,1);
  rengine::vec4::vec4(&local_100,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_f0,local_100,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x0;
    local_110 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,1);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_110);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_120,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_120);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7a,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((int)local_1c < 0) {
    __assert_fail("r >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7d,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w <= (int)local_1c) {
    __assert_fail("r < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7d,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 1) {
    __assert_fail("0 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7d,"virtual void TexturesOnViewportEdge::check()");
  }
  local_130 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c,0);
  rengine::vec4::vec4(&local_140,0.0,0.25,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_130,local_140,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_1c);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)local_1c;
    local_150 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c,0);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_150);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_160,0.0,0.25,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_160);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7d,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((int)(local_1c - 1) < 0) {
    __assert_fail("r-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7e,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w <= (int)(local_1c - 1)) {
    __assert_fail("r-1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7e,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 1) {
    __assert_fail("0 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7e,"virtual void TexturesOnViewportEdge::check()");
  }
  local_170 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c - 1,0);
  rengine::vec4::vec4(&local_180,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_170,local_180,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_1c - 1);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(local_1c - 1);
    local_190 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c - 1,0);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_190);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_1a0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_1a0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7e,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((int)local_1c < 0) {
    __assert_fail("r >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7f,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w <= (int)local_1c) {
    __assert_fail("r < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7f,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 2) {
    __assert_fail("1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7f,"virtual void TexturesOnViewportEdge::check()");
  }
  local_1b0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c,1);
  rengine::vec4::vec4(&local_1c0,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_1b0,local_1c0,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_1c);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)local_1c;
    local_1d0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c,1);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_1d0);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_1e0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_1e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x7f,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((int)(local_1c - 1) < 0) {
    __assert_fail("r-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x80,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w <= (int)(local_1c - 1)) {
    __assert_fail("r-1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x80,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 2) {
    __assert_fail("1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x80,"virtual void TexturesOnViewportEdge::check()");
  }
  local_1f0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c - 1,1);
  rengine::vec4::vec4(&local_200,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_1f0,local_200,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_1c - 1);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(local_1c - 1);
    local_210 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c - 1,1);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_210);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_220,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_220);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x80,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 1) {
    __assert_fail("0 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x83,"virtual void TexturesOnViewportEdge::check()");
  }
  if (local_20 < 0) {
    __assert_fail("b >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x83,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h <= local_20) {
    __assert_fail("b < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x83,"virtual void TexturesOnViewportEdge::check()");
  }
  local_230 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,local_20);
  rengine::vec4::vec4(&local_240,0.0,0.0,0.75,1.0);
  bVar1 = rengine::fuzzy_equals(local_230,local_240,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x0;
    local_250 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,local_20);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_250);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_260,0.0,0.0,0.75,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_260);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x83,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 2) {
    __assert_fail("1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x84,"virtual void TexturesOnViewportEdge::check()");
  }
  if (local_20 < 0) {
    __assert_fail("b >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x84,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h <= local_20) {
    __assert_fail("b < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x84,"virtual void TexturesOnViewportEdge::check()");
  }
  local_270 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,local_20);
  rengine::vec4::vec4(&local_280,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_270,local_280,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,1);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x1;
    local_290 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,local_20);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_290);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_2a0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_2a0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x84,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 1) {
    __assert_fail("0 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x85,"virtual void TexturesOnViewportEdge::check()");
  }
  if (local_20 + -1 < 0) {
    __assert_fail("b-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x85,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h <= local_20 + -1) {
    __assert_fail("b-1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x85,"virtual void TexturesOnViewportEdge::check()");
  }
  local_2b0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,local_20 + -1);
  rengine::vec4::vec4(&local_2c0,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_2b0,local_2c0,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20 + -1);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x0;
    local_2d0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,local_20 + -1);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_2d0);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_2e0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_2e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x85,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 2) {
    __assert_fail("1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x86,"virtual void TexturesOnViewportEdge::check()");
  }
  if (local_20 + -1 < 0) {
    __assert_fail("b-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x86,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h <= local_20 + -1) {
    __assert_fail("b-1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x86,"virtual void TexturesOnViewportEdge::check()");
  }
  local_2f0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,local_20 + -1);
  rengine::vec4::vec4(&local_300,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_2f0,local_300,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,1);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20 + -1);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x1;
    local_310 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,local_20 + -1);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_310);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_320,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_320);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x86,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((int)local_1c < 0) {
    __assert_fail("r >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x89,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w <= (int)local_1c) {
    __assert_fail("r < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x89,"virtual void TexturesOnViewportEdge::check()");
  }
  if (local_20 < 0) {
    __assert_fail("b >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x89,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h <= local_20) {
    __assert_fail("b < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x89,"virtual void TexturesOnViewportEdge::check()");
  }
  local_330 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c,local_20);
  rengine::vec4::vec4(&local_340,0.5,0.5,0.5,1.0);
  bVar1 = rengine::fuzzy_equals(local_330,local_340,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_1c);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)local_1c;
    local_350 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c,local_20);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_350);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_360,0.5,0.5,0.5,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_360);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x89,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((int)(local_1c - 1) < 0) {
    __assert_fail("r-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8a,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w <= (int)(local_1c - 1)) {
    __assert_fail("r-1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8a,"virtual void TexturesOnViewportEdge::check()");
  }
  if (local_20 < 0) {
    __assert_fail("b >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8a,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h <= local_20) {
    __assert_fail("b < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8a,"virtual void TexturesOnViewportEdge::check()");
  }
  local_370 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c - 1,local_20);
  rengine::vec4::vec4(&local_380,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_370,local_380,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_1c - 1);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(local_1c - 1);
    local_390 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,local_1c - 1,local_20);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_390);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_3a0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_3a0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8a,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((int)local_1c < 0) {
    __assert_fail("r >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8b,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w <= (int)local_1c) {
    __assert_fail("r < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8b,"virtual void TexturesOnViewportEdge::check()");
  }
  if (local_20 + -1 < 0) {
    __assert_fail("b-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8b,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h <= local_20 + -1) {
    __assert_fail("b-1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8b,"virtual void TexturesOnViewportEdge::check()");
  }
  local_3b0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,local_1c,local_20 + -1)
  ;
  rengine::vec4::vec4(&local_3c0,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_3b0,local_3c0,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_1c);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20 + -1);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)local_1c;
    local_3d0 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,local_1c,local_20 + -1);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_3d0);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_3e0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_3e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8b,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((int)(local_1c - 1) < 0) {
    __assert_fail("r-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8c,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_w <= (int)(local_1c - 1)) {
    __assert_fail("r-1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8c,"virtual void TexturesOnViewportEdge::check()");
  }
  if (local_20 + -1 < 0) {
    __assert_fail("b-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8c,"virtual void TexturesOnViewportEdge::check()");
  }
  if ((this->super_StaticRenderTest).m_h <= local_20 + -1) {
    __assert_fail("b-1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0x8c,"virtual void TexturesOnViewportEdge::check()");
  }
  local_3f0 = rengine::StaticRenderTest::pixel
                        (&this->super_StaticRenderTest,local_1c - 1,local_20 + -1);
  rengine::vec4::vec4(&local_400,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_3f0,local_400,0.01);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_1c - 1);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20 + -1);
  poVar2 = std::operator<<(poVar2,")=");
  poVar4 = (ostream *)(ulong)(local_1c - 1);
  local_410 = rengine::StaticRenderTest::pixel
                        (&this->super_StaticRenderTest,local_1c - 1,local_20 + -1);
  poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_410);
  pcVar5 = "; expected=";
  poVar2 = std::operator<<(poVar2,"; expected=");
  rengine::vec4::vec4(&local_420,0.0,0.0,0.0,1.0);
  poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_420);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,0x8c,"virtual void TexturesOnViewportEdge::check()");
}

Assistant:

void check() override {
        vec2 s = surface()->size();

        int r = s.x - 1;
        int b = s.y - 1;

        // Top/left 50% red
        check_pixel(0, 0, vec4(0.5, 0, 0, 1));
        check_pixel(1, 0, vec4(0.0, 0, 0, 1));
        check_pixel(1, 1, vec4(0.0, 0, 0, 1));
        check_pixel(0, 1, vec4(0.0, 0, 0, 1));

        // Top/right 25% green
        check_pixel(r,   0, vec4(0, 0.25, 0, 1));
        check_pixel(r-1, 0, vec4(0.0, 0, 0, 1));
        check_pixel(r,   1, vec4(0.0, 0, 0, 1));
        check_pixel(r-1, 1, vec4(0.0, 0, 0, 1));

        // Bottom/left 75% blue
        check_pixel(0, b,   vec4(0, 0, 0.75, 1));
        check_pixel(1, b,   vec4(0, 0, 0, 1));
        check_pixel(0, b-1, vec4(0, 0, 0, 1));
        check_pixel(1, b-1, vec4(0, 0, 0, 1));

        // Top/right 50% white
        check_pixel(r, b,  vec4(0.5, 0.5, 0.5, 1));
        check_pixel(r-1, b, vec4(0, 0, 0, 1));
        check_pixel(r, b-1, vec4(0, 0, 0, 1));
        check_pixel(r-1, b-1, vec4(0, 0, 0, 1));
    }